

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O1

void __thiscall DepsLog::~DepsLog(DepsLog *this)

{
  pointer ppDVar1;
  pointer ppNVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  Close(this);
  ppDVar1 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppDVar1 != (pointer)0x0) {
    operator_delete(ppDVar1,(long)(this->deps_).
                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppDVar1
                   );
  }
  ppNVar2 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar2 != (pointer)0x0) {
    operator_delete(ppNVar2,(long)(this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar2
                   );
  }
  pcVar3 = (this->file_path_)._M_dataplus._M_p;
  paVar4 = &(this->file_path_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

DepsLog::~DepsLog() {
  Close();
}